

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

Node<QString,_QList<int>_> * __thiscall
QHashPrivate::Data<QHashPrivate::Node<QString,_QList<int>_>_>::findNode<QString>
          (Data<QHashPrivate::Node<QString,_QList<int>_>_> *this,QString *key)

{
  ulong uVar1;
  Node<QString,_QList<int>_> *pNVar2;
  Bucket BVar3;
  
  BVar3 = findBucket<QString>(this,key);
  uVar1 = (ulong)(byte)BVar3.span[BVar3.index];
  if (uVar1 == 0xff) {
    pNVar2 = (Node<QString,_QList<int>_> *)0x0;
  }
  else {
    pNVar2 = (Node<QString,_QList<int>_> *)(uVar1 * 0x30 + *(long *)(BVar3.span + 0x80));
  }
  return pNVar2;
}

Assistant:

Node *findNode(const K &key) const noexcept
    {
        auto bucket = findBucket(key);
        if (bucket.isUnused())
            return nullptr;
        return bucket.node();
    }